

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void uECC_vli_mult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  uECC_word_t uVar10;
  uECC_word_t uVar11;
  uECC_word_t uVar12;
  ulong *puVar13;
  long lVar14;
  wordcount_t wVar15;
  char cVar16;
  ulong uVar17;
  uECC_word_t *puVar18;
  bool bVar19;
  
  if (num_words < '\x01') {
    uVar11 = 0;
    uVar12 = 0;
  }
  else {
    lVar8 = 1;
    uVar17 = 0;
    uVar10 = 0;
    uVar12 = 0;
    puVar18 = right;
    do {
      uVar11 = uVar12;
      lVar14 = 0;
      uVar12 = 0;
      puVar13 = puVar18;
      do {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *puVar13;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = left[lVar14];
        uVar7 = SUB168(auVar2 * auVar4,8);
        uVar6 = SUB168(auVar2 * auVar4,0);
        bVar19 = CARRY8(uVar10,uVar6);
        uVar10 = uVar10 + uVar6;
        uVar6 = (ulong)bVar19;
        bVar19 = CARRY8(uVar11,uVar7);
        uVar7 = uVar11 + uVar7;
        uVar11 = uVar7 + uVar6;
        uVar12 = uVar12 + (bVar19 || CARRY8(uVar7,uVar6));
        lVar14 = lVar14 + 1;
        puVar13 = puVar13 + -1;
      } while (lVar8 != lVar14);
      result[uVar17] = uVar10;
      uVar17 = uVar17 + 1;
      lVar8 = lVar8 + 1;
      puVar18 = puVar18 + 1;
      uVar10 = uVar11;
    } while (uVar17 != (byte)num_words);
  }
  iVar1 = num_words * 2 + -1;
  if (num_words < iVar1) {
    cVar9 = '\x01';
    uVar10 = uVar11;
    wVar15 = num_words;
    do {
      uVar11 = uVar12;
      cVar16 = wVar15 + '\x01';
      if ((char)(cVar16 - num_words) < num_words) {
        lVar8 = (long)cVar9;
        puVar13 = right + (wVar15 - lVar8);
        uVar12 = 0;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *puVar13;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = left[lVar8];
          uVar6 = SUB168(auVar3 * auVar5,8);
          uVar17 = SUB168(auVar3 * auVar5,0);
          bVar19 = CARRY8(uVar10,uVar17);
          uVar10 = uVar10 + uVar17;
          uVar17 = (ulong)bVar19;
          bVar19 = CARRY8(uVar11,uVar6);
          uVar6 = uVar11 + uVar6;
          uVar11 = uVar6 + uVar17;
          uVar12 = uVar12 + (bVar19 || CARRY8(uVar6,uVar17));
          lVar8 = lVar8 + 1;
          puVar13 = puVar13 + -1;
        } while (lVar8 < num_words);
      }
      else {
        uVar12 = 0;
      }
      result[wVar15] = uVar10;
      cVar9 = cVar9 + '\x01';
      uVar10 = uVar11;
      wVar15 = cVar16;
    } while (cVar16 < iVar1);
  }
  result[iVar1] = uVar11;
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_mult(uECC_word_t *result,
                                const uECC_word_t *left,
                                const uECC_word_t *right,
                                wordcount_t num_words) {
    uECC_word_t r0 = 0;
    uECC_word_t r1 = 0;
    uECC_word_t r2 = 0;
    wordcount_t i, k;

    /* Compute each digit of result in sequence, maintaining the carries. */
    for (k = 0; k < num_words; ++k) {
        for (i = 0; i <= k; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    for (k = num_words; k < num_words * 2 - 1; ++k) {
        for (i = (k + 1) - num_words; i < num_words; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    result[num_words * 2 - 1] = r0;
}